

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test_pdf<trng::hypergeometric_dist>(hypergeometric_dist *d)

{
  StringRef capturedExpression;
  int iVar1;
  hypergeometric_dist *in_RDI;
  double dVar2;
  AssertionHandler catchAssertionHandler;
  double diff;
  double p;
  double P;
  int i;
  ITransientExpression *in_stack_fffffffffffffee8;
  ExprLhs<const_double_&> in_stack_fffffffffffffef0;
  StringRef *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int iVar3;
  char *in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  ExprLhs<const_double_&> *in_stack_ffffffffffffff18;
  ITransientExpression local_90;
  StringRef local_80;
  double local_28;
  StringRef *local_20;
  StringRef *local_18;
  int local_c;
  hypergeometric_dist *local_8;
  
  local_8 = in_RDI;
  local_c = trng::hypergeometric_dist::min(in_RDI);
  local_18 = (StringRef *)
             trng::hypergeometric_dist::cdf
                       ((hypergeometric_dist *)in_stack_fffffffffffffef8,
                        (int)((ulong)in_stack_fffffffffffffef0.m_lhs >> 0x20));
  while ((double)local_18 < 0.95) {
    local_20 = local_18;
    iVar3 = local_c;
    iVar1 = trng::hypergeometric_dist::min(local_8);
    if (iVar1 < iVar3) {
      dVar2 = trng::hypergeometric_dist::cdf
                        ((hypergeometric_dist *)in_stack_fffffffffffffef8,
                         (int)((ulong)in_stack_fffffffffffffef0.m_lhs >> 0x20));
      local_20 = (StringRef *)((double)local_20 - dVar2);
    }
    in_stack_fffffffffffffef8 = local_20;
    local_28 = trng::hypergeometric_dist::pdf
                         ((hypergeometric_dist *)local_20,
                          (int)((ulong)in_stack_fffffffffffffef0.m_lhs >> 0x20));
    local_28 = (double)in_stack_fffffffffffffef8 - local_28;
    local_80 = operator____catch_sr
                         ((char *)in_stack_fffffffffffffef0.m_lhs,(size_t)in_stack_fffffffffffffee8)
    ;
    in_stack_fffffffffffffee8 = &local_90;
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)in_stack_fffffffffffffee8,
               "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
               ,0xeb);
    Catch::StringRef::StringRef
              ((StringRef *)CONCAT44(iVar3,in_stack_ffffffffffffff00),
               (char *)in_stack_fffffffffffffef8);
    capturedExpression.m_size = (size_type)in_stack_ffffffffffffff10;
    capturedExpression.m_start = in_stack_ffffffffffffff08;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)CONCAT44(iVar3,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8,(SourceLineInfo *)in_stack_fffffffffffffef0.m_lhs,
               capturedExpression,(Flags)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    in_stack_fffffffffffffef0 =
         Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffee8,(double *)0x38d0d1);
    dVar2 = Catch::clara::std::numeric_limits<double>::epsilon();
    in_stack_ffffffffffffff08 = (char *)(dVar2 * 128.0);
    Catch::ExprLhs<double_const&>::operator<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)in_stack_fffffffffffffef0.m_lhs,in_stack_fffffffffffffee8);
    Catch::BinaryExpr<const_double_&,_const_double_&>::~BinaryExpr
              ((BinaryExpr<const_double_&,_const_double_&> *)0x38d12d);
    Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffef0.m_lhs);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffef0.m_lhs);
    local_c = local_c + 1;
    local_18 = (StringRef *)
               trng::hypergeometric_dist::cdf
                         ((hypergeometric_dist *)in_stack_fffffffffffffef8,
                          (int)((ulong)in_stack_fffffffffffffef0.m_lhs >> 0x20));
  }
  return;
}

Assistant:

void discrete_dist_test_pdf(dist &d) {
  int i{d.min()};
  double P{d.cdf(i)};
  while (P < 0.95) {
    double p{P};
    if (i > d.min())
      p -= d.cdf(i - 1);
    const double diff{p - d.pdf(i)};
    REQUIRE(diff < 128 * std::numeric_limits<double>::epsilon());
    ++i;
    P = d.cdf(i);
  }
}